

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall
spv::Builder::createMemoryBarrier(Builder *this,uint executionScope,uint memorySemantics)

{
  Id IVar1;
  Instruction *pIVar2;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_28;
  Instruction *local_20;
  Instruction *op;
  uint memorySemantics_local;
  uint executionScope_local;
  Builder *this_local;
  
  op._0_4_ = memorySemantics;
  op._4_4_ = executionScope;
  _memorySemantics_local = this;
  pIVar2 = (Instruction *)::operator_new(0x60);
  spv::Instruction::Instruction(pIVar2,OpMemoryBarrier);
  local_20 = pIVar2;
  spv::Instruction::reserveOperands(pIVar2,2);
  pIVar2 = local_20;
  IVar1 = makeUintConstant(this,op._4_4_,false);
  spv::Instruction::addIdOperand(pIVar2,IVar1);
  pIVar2 = local_20;
  IVar1 = makeUintConstant(this,(uint)op,false);
  spv::Instruction::addIdOperand(pIVar2,IVar1);
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_28,
             local_20);
  addInstruction(this,&local_28);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_28);
  return;
}

Assistant:

void Builder::createMemoryBarrier(unsigned executionScope, unsigned memorySemantics)
{
    Instruction* op = new Instruction(OpMemoryBarrier);
    op->reserveOperands(2);
    op->addIdOperand(makeUintConstant(executionScope));
    op->addIdOperand(makeUintConstant(memorySemantics));
    addInstruction(std::unique_ptr<Instruction>(op));
}